

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void mp::format(BasicFormatter<char,_fmt::ArgFormatter<char>_> *f,char **param_2,NumericExpr e)

{
  BasicStringRef<char> value;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer> local_248;
  MemoryWriter writer;
  
  writer.super_BasicWriter<char>.buffer_ = &writer.buffer_.super_Buffer<char>;
  writer.super_BasicWriter<char>._vptr_BasicWriter = (_func_int **)&PTR__BasicMemoryWriter_0016da38;
  writer.buffer_.super_Buffer<char>.ptr_ = writer.buffer_.data_;
  writer.buffer_.super_Buffer<char>.size_ = 0;
  writer.buffer_.super_Buffer<char>.capacity_ = 500;
  writer.buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_0016da80;
  local_248.
  super_BasicExprVisitor<mp::ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>,_void,_mp::internal::ExprTypes>
  ._vptr_BasicExprVisitor = (_func_int **)&PTR__BasicExprVisitor_0016e760;
  local_248.writer_ = &writer.super_BasicWriter<char>;
  local_248.precedence_ = 0;
  ExprWriter<mp::internal::ExprTypes,_mp::GenericVarNamer>::Visit
            (&local_248,(NumericExpr)e.super_ExprBase.impl_,-1);
  value.data_ = (writer.super_BasicWriter<char>.buffer_)->ptr_;
  value.size_ = (writer.super_BasicWriter<char>.buffer_)->size_;
  fmt::BasicWriter<char>::operator<<(f->writer_,value);
  fmt::BasicMemoryWriter<char,_std::allocator<char>_>::~BasicMemoryWriter(&writer);
  return;
}

Assistant:

void mp::format(fmt::BasicFormatter<char> &f, const char *&, NumericExpr e) {
  fmt::MemoryWriter writer;
  ExprWriter<internal::ExprTypes>(writer).Visit(e);
  f.writer() << fmt::StringRef(writer.data(), writer.size());
}